

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> * __thiscall
chaiscript::dispatch::detail::
build_param_type_list<bool,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&>
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,detail *this,_func_bool_Type_Info_ptr_Type_Info_ptr *param_1)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_51;
  Type_Info local_50;
  pointer_____offset_0x10___ *local_38;
  pointer_____offset_0x10___ *local_30;
  undefined4 local_28;
  pointer_____offset_0x10___ *local_20;
  pointer_____offset_0x10___ *local_18;
  undefined4 local_10;
  
  local_50.m_type_info = (type_info *)&bool::typeinfo;
  local_50.m_bare_type_info = (type_info *)&bool::typeinfo;
  local_50.m_flags = 0;
  local_38 = &Type_Info::typeinfo;
  local_30 = &Type_Info::typeinfo;
  local_28 = 3;
  local_20 = &Type_Info::typeinfo;
  local_18 = &Type_Info::typeinfo;
  __l._M_len = 3;
  __l._M_array = &local_50;
  local_10 = local_28;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (__return_storage_ptr__,__l,&local_51);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }